

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_simcontext.cpp
# Opt level: O1

sc_object * __thiscall sc_core::sc_simcontext::find_object(sc_simcontext *this,char *name)

{
  sc_object *psVar1;
  
  if (find_object(char_const*)::warn_find_object == '\0') {
    find_object(char_const*)::warn_find_object = '\x01';
    sc_report_handler::report
              (SC_INFO,"/IEEE_Std_1666/deprecated",
               "sc_simcontext::find_object() is deprecated,\n use sc_find_object()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_simcontext.cpp"
               ,0x43a);
  }
  psVar1 = sc_object_manager::find_object(this->m_object_manager,name);
  return psVar1;
}

Assistant:

sc_object*
sc_simcontext::find_object( const char* name )
{
    static bool warn_find_object=true;
    if ( warn_find_object )
    {
	warn_find_object = false;
	SC_REPORT_INFO(SC_ID_IEEE_1666_DEPRECATION_,
	    "sc_simcontext::find_object() is deprecated,\n" \
            " use sc_find_object()" );
    }
    return m_object_manager->find_object( name );
}